

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O2

TPZFYsmpMatrix<std::complex<float>_> * __thiscall
TPZFYsmpMatrix<std::complex<float>_>::operator=
          (TPZFYsmpMatrix<std::complex<float>_> *this,TPZVerySparseMatrix<std::complex<float>_> *cp)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  long *plVar4;
  _Self __tmp;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  long lVar7;
  
  lVar1 = (cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  sVar2 = (cp->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (*(this->fJA)._vptr_TPZVec[3])(&this->fJA,sVar2);
  (*(this->fA)._vptr_TPZVec[3])(&this->fA,sVar2);
  (*(this->fIA)._vptr_TPZVec[3])(&this->fIA,lVar1 + 1);
  *(this->fIA).fStore = 0;
  lVar7 = 0;
  lVar6 = 0;
  for (p_Var5 = (cp->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(cp->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    lVar3 = *(long *)(p_Var5 + 1);
    if (lVar7 != lVar3) {
      plVar4 = (this->fIA).fStore;
      while (lVar7 = lVar7 + 1, lVar7 < lVar3) {
        plVar4[lVar7] = lVar6;
      }
      (this->fIA).fStore[lVar3] = lVar6;
      lVar7 = lVar3;
    }
    (this->fJA).fStore[lVar6] = (long)p_Var5[1]._M_parent;
    (this->fA).fStore[lVar6]._M_value = (_ComplexT)p_Var5[1]._M_left;
    lVar6 = lVar6 + 1;
  }
  plVar4 = (this->fIA).fStore;
  for (; lVar7 < lVar1; lVar7 = lVar7 + 1) {
    plVar4[lVar7 + 1] = lVar6;
  }
  return this;
}

Assistant:

TPZFYsmpMatrix<TVar> &TPZFYsmpMatrix<TVar>::operator=(const TPZVerySparseMatrix<TVar> &cp)
{
	// Deletes everything associated with a TPZFYsmpMatrix
	int64_t nrows = cp.Rows();
	
	int64_t count = 0, c = 0, r = 0;
	
	count = cp.fExtraSparseData.size();
	fJA.resize(count);
    fA.resize(count);
    fIA.resize(nrows+1);
	fIA[0] = 0;
	
	typename map< pair<int64_t,int64_t>, TVar>::const_iterator it;
	c = 0;
	r = 0;
	for(it=cp.fExtraSparseData.begin(); it!= cp.fExtraSparseData.end(); it++)
	{
		int64_t row = it->first.first;
		if(r != row)
		{
			r++;
			while(r < row) 
			{
				fIA[r] = c;
				r++;
			}
			fIA[row] = c;
			r = row;
		}
		int64_t col = it->first.second;
		fJA[c] = col;
		TVar val = it->second;
		fA[c] = val;
		c++;
	}
	r++;
	while(r<=nrows)
	{
		fIA[r] = c;
		r++;
	}
	return *this;
}